

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

inflate_allocs * alloc_inflate(zng_stream *strm)

{
  void *pvVar1;
  inflate_allocs *piVar2;
  ulong uVar3;
  
  pvVar1 = (*strm->zalloc)(strm->opaque,1,0xa4c0);
  if (pvVar1 == (void *)0x0) {
    piVar2 = (inflate_allocs *)0x0;
  }
  else {
    uVar3 = (ulong)(-(int)pvVar1 & 0x3f);
    piVar2 = (inflate_allocs *)((long)pvVar1 + uVar3 + 0xa440);
    *(void **)((long)pvVar1 + uVar3 + 0xa440) = pvVar1;
    *(free_func *)((long)pvVar1 + uVar3 + 0xa448) = strm->zfree;
    *(ulong *)((long)pvVar1 + uVar3 + 0xa458) = (long)pvVar1 + uVar3;
    *(ulong *)((long)pvVar1 + uVar3 + 0xa450) = (long)pvVar1 + uVar3 + 0x8040;
  }
  return piVar2;
}

Assistant:

Z_INTERNAL inflate_allocs* alloc_inflate(PREFIX3(stream) *strm) {
    int curr_size = 0;

    /* Define sizes */
    int window_size = INFLATE_ADJUST_WINDOW_SIZE((1 << MAX_WBITS) + 64); /* 64B padding for chunksize */
    int state_size = sizeof(inflate_state);
    int alloc_size = sizeof(inflate_allocs);

    /* Calculate relative buffer positions and paddings */
    LOGSZP("window", window_size, PAD_WINDOW(curr_size), PADSZ(curr_size,WINDOW_PAD_SIZE));
    int window_pos = PAD_WINDOW(curr_size);
    curr_size = window_pos + window_size;

    LOGSZP("state", state_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int state_pos = PAD_64(curr_size);
    curr_size = state_pos + state_size;

    LOGSZP("alloc", alloc_size, PAD_16(curr_size), PADSZ(curr_size,16));
    int alloc_pos = PAD_16(curr_size);
    curr_size = alloc_pos + alloc_size;

    /* Add 64-1 or 4096-1 to allow window alignment, and round size of buffer up to multiple of 64 */
    int total_size = PAD_64(curr_size + (WINDOW_PAD_SIZE - 1));

    /* Allocate buffer, align to 64-byte cacheline, and zerofill the resulting buffer */
    char *original_buf = (char *)strm->zalloc(strm->opaque, 1, total_size);
    if (original_buf == NULL)
        return NULL;

    char *buff = (char *)HINT_ALIGNED_WINDOW((char *)PAD_WINDOW(original_buf));
    LOGSZPL("Buffer alloc", total_size, PADSZ((uintptr_t)original_buf,WINDOW_PAD_SIZE), PADSZ(curr_size,WINDOW_PAD_SIZE));

    /* Initialize alloc_bufs */
    inflate_allocs *alloc_bufs  = (struct inflate_allocs_s *)(buff + alloc_pos);
    alloc_bufs->buf_start = original_buf;
    alloc_bufs->zfree = strm->zfree;

    alloc_bufs->window =  (unsigned char *)HINT_ALIGNED_WINDOW((buff + window_pos));
    alloc_bufs->state = (inflate_state *)HINT_ALIGNED_64((buff + state_pos));

#ifdef Z_MEMORY_SANITIZER
    /* This is _not_ to subvert the memory sanitizer but to instead unposion some
       data we willingly and purposefully load uninitialized into vector registers
       in order to safely read the last < chunksize bytes of the window. */
    __msan_unpoison(alloc_bufs->window + window_size, 64);
#endif

    return alloc_bufs;
}